

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O0

void cftmdl2(int n,double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double y2i;
  double y2r;
  double y0i;
  double y0r;
  double x3i;
  double x3r;
  double x2i;
  double x2r;
  double x1i;
  double x1r;
  double x0i;
  double x0r;
  double wd3i;
  double wd3r;
  double wd1i;
  double wd1r;
  double wk3i;
  double wk3r;
  double wk1i;
  double wk1r;
  double wn4r;
  int mh;
  int m;
  int kr;
  int k;
  int j3;
  int j2;
  int j1;
  int j0;
  int j;
  double *w_local;
  double *a_local;
  int n_local;
  
  iVar4 = n >> 3;
  iVar5 = iVar4 * 2;
  dVar13 = w[1];
  iVar6 = iVar4 * 4;
  iVar7 = iVar4 * 6;
  dVar12 = *a;
  dVar23 = a[iVar6 + 1];
  dVar26 = a[1];
  dVar21 = a[iVar6];
  dVar22 = *a;
  dVar1 = a[iVar6 + 1];
  dVar2 = a[1];
  dVar18 = a[iVar6];
  dVar19 = a[iVar5];
  dVar20 = a[iVar7 + 1];
  dVar24 = a[iVar5 + 1];
  dVar25 = a[iVar7];
  dVar10 = dVar13 * ((a[iVar5] - a[iVar7 + 1]) - (a[iVar5 + 1] + a[iVar7]));
  dVar11 = dVar13 * (a[iVar5 + 1] + a[iVar7] + (a[iVar5] - a[iVar7 + 1]));
  *a = (dVar12 - dVar23) + dVar10;
  a[1] = dVar26 + dVar21 + dVar11;
  a[iVar5] = (dVar12 - dVar23) - dVar10;
  a[iVar5 + 1] = (dVar26 + dVar21) - dVar11;
  dVar12 = dVar13 * ((dVar19 + dVar20) - (dVar24 - dVar25));
  dVar13 = dVar13 * ((dVar24 - dVar25) + dVar19 + dVar20);
  a[iVar6] = (dVar22 + dVar1) - dVar13;
  a[iVar6 + 1] = (dVar2 - dVar18) + dVar12;
  a[iVar7] = dVar22 + dVar1 + dVar13;
  a[iVar7 + 1] = (dVar2 - dVar18) - dVar12;
  m = 0;
  mh = iVar4 << 2;
  for (j1 = 2; j1 < iVar4; j1 = j1 + 2) {
    dVar13 = w[m + 4];
    dVar12 = w[m + 5];
    dVar23 = w[m + 6];
    dVar26 = w[m + 7];
    dVar21 = w[mh + -4];
    dVar22 = w[mh + -3];
    dVar1 = w[mh + -2];
    dVar2 = w[mh + -1];
    iVar6 = j1 + iVar5;
    iVar7 = iVar6 + iVar5;
    iVar8 = iVar7 + iVar5;
    dVar18 = a[j1];
    dVar19 = a[iVar7 + 1];
    dVar20 = a[j1 + 1];
    dVar24 = a[iVar7];
    dVar25 = a[iVar6];
    dVar10 = a[iVar8 + 1];
    dVar11 = a[iVar6 + 1];
    dVar3 = a[iVar8];
    dVar14 = dVar13 * (a[j1] - a[iVar7 + 1]) + -(dVar12 * (a[j1 + 1] + a[iVar7]));
    dVar15 = dVar13 * (a[j1 + 1] + a[iVar7]) + dVar12 * (a[j1] - a[iVar7 + 1]);
    dVar16 = dVar22 * (a[iVar6] - a[iVar8 + 1]) + -(dVar21 * (a[iVar6 + 1] + a[iVar8]));
    dVar17 = dVar22 * (a[iVar6 + 1] + a[iVar8]) + dVar21 * (a[iVar6] - a[iVar8 + 1]);
    a[j1] = dVar14 + dVar16;
    a[j1 + 1] = dVar15 + dVar17;
    a[iVar6] = dVar14 - dVar16;
    a[iVar6 + 1] = dVar15 - dVar17;
    dVar14 = dVar23 * (dVar18 + dVar19) + dVar26 * (dVar20 - dVar24);
    dVar18 = dVar23 * (dVar20 - dVar24) + -(dVar26 * (dVar18 + dVar19));
    dVar19 = dVar2 * (dVar25 + dVar10) + dVar1 * (dVar11 - dVar3);
    dVar20 = dVar2 * (dVar11 - dVar3) + -(dVar1 * (dVar25 + dVar10));
    a[iVar7] = dVar14 + dVar19;
    a[iVar7 + 1] = dVar18 + dVar20;
    a[iVar8] = dVar14 - dVar19;
    a[iVar8 + 1] = dVar18 - dVar20;
    iVar6 = iVar5 - j1;
    iVar7 = iVar6 + iVar5;
    iVar8 = iVar7 + iVar5;
    iVar9 = iVar8 + iVar5;
    dVar18 = a[iVar6];
    dVar19 = a[iVar8 + 1];
    dVar20 = a[iVar6 + 1];
    dVar24 = a[iVar8];
    dVar25 = a[iVar7];
    dVar10 = a[iVar9 + 1];
    dVar11 = a[iVar7 + 1];
    dVar3 = a[iVar9];
    dVar14 = dVar21 * (a[iVar6] - a[iVar8 + 1]) + -(dVar22 * (a[iVar6 + 1] + a[iVar8]));
    dVar21 = dVar21 * (a[iVar6 + 1] + a[iVar8]) + dVar22 * (a[iVar6] - a[iVar8 + 1]);
    dVar22 = dVar12 * (a[iVar7] - a[iVar9 + 1]) + -(dVar13 * (a[iVar7 + 1] + a[iVar9]));
    dVar13 = dVar12 * (a[iVar7 + 1] + a[iVar9]) + dVar13 * (a[iVar7] - a[iVar9 + 1]);
    a[iVar6] = dVar14 + dVar22;
    a[iVar6 + 1] = dVar21 + dVar13;
    a[iVar7] = dVar14 - dVar22;
    a[iVar7 + 1] = dVar21 - dVar13;
    dVar13 = dVar1 * (dVar18 + dVar19) + dVar2 * (dVar20 - dVar24);
    dVar12 = dVar1 * (dVar20 - dVar24) + -(dVar2 * (dVar18 + dVar19));
    dVar21 = dVar26 * (dVar25 + dVar10) + dVar23 * (dVar11 - dVar3);
    dVar23 = dVar26 * (dVar11 - dVar3) + -(dVar23 * (dVar25 + dVar10));
    a[iVar8] = dVar13 + dVar21;
    a[iVar8 + 1] = dVar12 + dVar23;
    a[iVar9] = dVar13 - dVar21;
    a[iVar9 + 1] = dVar12 - dVar23;
    mh = mh + -4;
    m = m + 4;
  }
  dVar13 = w[iVar5];
  dVar12 = w[iVar5 + 1];
  iVar6 = iVar4 * 3;
  iVar7 = iVar4 * 5;
  iVar5 = iVar4 * 7;
  dVar23 = a[iVar4];
  dVar26 = a[iVar7 + 1];
  dVar21 = a[iVar4 + 1];
  dVar22 = a[iVar7];
  dVar1 = a[iVar6];
  dVar2 = a[iVar5 + 1];
  dVar18 = a[iVar6 + 1];
  dVar19 = a[iVar5];
  dVar20 = dVar13 * (a[iVar4] - a[iVar7 + 1]) + -(dVar12 * (a[iVar4 + 1] + a[iVar7]));
  dVar24 = dVar13 * (a[iVar4 + 1] + a[iVar7]) + dVar12 * (a[iVar4] - a[iVar7 + 1]);
  dVar25 = dVar12 * (a[iVar6] - a[iVar5 + 1]) + -(dVar13 * (a[iVar6 + 1] + a[iVar5]));
  dVar10 = dVar12 * (a[iVar6 + 1] + a[iVar5]) + dVar13 * (a[iVar6] - a[iVar5 + 1]);
  a[iVar4] = dVar20 + dVar25;
  a[iVar4 + 1] = dVar24 + dVar10;
  a[iVar6] = dVar20 - dVar25;
  a[iVar6 + 1] = dVar24 - dVar10;
  dVar20 = dVar12 * (dVar23 + dVar26) + -(dVar13 * (dVar21 - dVar22));
  dVar23 = dVar12 * (dVar21 - dVar22) + dVar13 * (dVar23 + dVar26);
  dVar26 = dVar13 * (dVar1 + dVar2) + -(dVar12 * (dVar18 - dVar19));
  dVar13 = dVar13 * (dVar18 - dVar19) + dVar12 * (dVar1 + dVar2);
  a[iVar7] = dVar20 - dVar26;
  a[iVar7 + 1] = dVar23 - dVar13;
  a[iVar5] = dVar20 + dVar26;
  a[iVar5 + 1] = dVar23 + dVar13;
  return;
}

Assistant:

void cftmdl2(int n, FFTFLT *a, FFTFLT *w)
{
    int j, j0, j1, j2, j3, k, kr, m, mh;
    FFTFLT wn4r, wk1r, wk1i, wk3r, wk3i, wd1r, wd1i, wd3r, wd3i;
    FFTFLT x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i, y0r, y0i, y2r, y2i;

    mh = n >> 3;
    m = 2 * mh;
    wn4r = w[1];
    j1 = m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[0] - a[j2 + 1];
    x0i = a[1] + a[j2];
    x1r = a[0] + a[j2 + 1];
    x1i = a[1] - a[j2];
    x2r = a[j1] - a[j3 + 1];
    x2i = a[j1 + 1] + a[j3];
    x3r = a[j1] + a[j3 + 1];
    x3i = a[j1 + 1] - a[j3];
    y0r = wn4r * (x2r - x2i);
    y0i = wn4r * (x2i + x2r);
    a[0] = x0r + y0r;
    a[1] = x0i + y0i;
    a[j1] = x0r - y0r;
    a[j1 + 1] = x0i - y0i;
    y0r = wn4r * (x3r - x3i);
    y0i = wn4r * (x3i + x3r);
    a[j2] = x1r - y0i;
    a[j2 + 1] = x1i + y0r;
    a[j3] = x1r + y0i;
    a[j3 + 1] = x1i - y0r;
    k = 0;
    kr = 2 * m;
    for (j = 2; j < mh; j += 2) {
        k += 4;
        wk1r = w[k];
        wk1i = w[k + 1];
        wk3r = w[k + 2];
        wk3i = w[k + 3];
        kr -= 4;
        wd1i = w[kr];
        wd1r = w[kr + 1];
        wd3i = w[kr + 2];
        wd3r = w[kr + 3];
        j1 = j + m;
        j2 = j1 + m;
        j3 = j2 + m;
        x0r = a[j] - a[j2 + 1];
        x0i = a[j + 1] + a[j2];
        x1r = a[j] + a[j2 + 1];
        x1i = a[j + 1] - a[j2];
        x2r = a[j1] - a[j3 + 1];
        x2i = a[j1 + 1] + a[j3];
        x3r = a[j1] + a[j3 + 1];
        x3i = a[j1 + 1] - a[j3];
        y0r = wk1r * x0r - wk1i * x0i;
        y0i = wk1r * x0i + wk1i * x0r;
        y2r = wd1r * x2r - wd1i * x2i;
        y2i = wd1r * x2i + wd1i * x2r;
        a[j] = y0r + y2r;
        a[j + 1] = y0i + y2i;
        a[j1] = y0r - y2r;
        a[j1 + 1] = y0i - y2i;
        y0r = wk3r * x1r + wk3i * x1i;
        y0i = wk3r * x1i - wk3i * x1r;
        y2r = wd3r * x3r + wd3i * x3i;
        y2i = wd3r * x3i - wd3i * x3r;
        a[j2] = y0r + y2r;
        a[j2 + 1] = y0i + y2i;
        a[j3] = y0r - y2r;
        a[j3 + 1] = y0i - y2i;
        j0 = m - j;
        j1 = j0 + m;
        j2 = j1 + m;
        j3 = j2 + m;
        x0r = a[j0] - a[j2 + 1];
        x0i = a[j0 + 1] + a[j2];
        x1r = a[j0] + a[j2 + 1];
        x1i = a[j0 + 1] - a[j2];
        x2r = a[j1] - a[j3 + 1];
        x2i = a[j1 + 1] + a[j3];
        x3r = a[j1] + a[j3 + 1];
        x3i = a[j1 + 1] - a[j3];
        y0r = wd1i * x0r - wd1r * x0i;
        y0i = wd1i * x0i + wd1r * x0r;
        y2r = wk1i * x2r - wk1r * x2i;
        y2i = wk1i * x2i + wk1r * x2r;
        a[j0] = y0r + y2r;
        a[j0 + 1] = y0i + y2i;
        a[j1] = y0r - y2r;
        a[j1 + 1] = y0i - y2i;
        y0r = wd3i * x1r + wd3r * x1i;
        y0i = wd3i * x1i - wd3r * x1r;
        y2r = wk3i * x3r + wk3r * x3i;
        y2i = wk3i * x3i - wk3r * x3r;
        a[j2] = y0r + y2r;
        a[j2 + 1] = y0i + y2i;
        a[j3] = y0r - y2r;
        a[j3 + 1] = y0i - y2i;
    }
    wk1r = w[m];
    wk1i = w[m + 1];
    j0 = mh;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] - a[j2 + 1];
    x0i = a[j0 + 1] + a[j2];
    x1r = a[j0] + a[j2 + 1];
    x1i = a[j0 + 1] - a[j2];
    x2r = a[j1] - a[j3 + 1];
    x2i = a[j1 + 1] + a[j3];
    x3r = a[j1] + a[j3 + 1];
    x3i = a[j1 + 1] - a[j3];
    y0r = wk1r * x0r - wk1i * x0i;
    y0i = wk1r * x0i + wk1i * x0r;
    y2r = wk1i * x2r - wk1r * x2i;
    y2i = wk1i * x2i + wk1r * x2r;
    a[j0] = y0r + y2r;
    a[j0 + 1] = y0i + y2i;
    a[j1] = y0r - y2r;
    a[j1 + 1] = y0i - y2i;
    y0r = wk1i * x1r - wk1r * x1i;
    y0i = wk1i * x1i + wk1r * x1r;
    y2r = wk1r * x3r - wk1i * x3i;
    y2i = wk1r * x3i + wk1i * x3r;
    a[j2] = y0r - y2r;
    a[j2 + 1] = y0i - y2i;
    a[j3] = y0r + y2r;
    a[j3 + 1] = y0i + y2i;
}